

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Data<8U> * read_standard_data<8u>(char *PATH,int interval,int *cnt)

{
  int iVar1;
  void *__addr;
  Data<8U> *pDVar2;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  int i;
  Data<8U> *data;
  void *raw_data;
  int num;
  uint8_t *raw_addr;
  int fd;
  stat buf;
  int local_d4;
  stat local_a8;
  int *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  iVar1 = open(in_RDI,0);
  fstat(iVar1,&local_a8);
  *local_18 = (int)(local_a8.st_size / (long)local_c);
  __addr = mmap((void *)0x0,local_a8.st_size,1,2,iVar1,0);
  close(iVar1);
  if (__addr == (void *)0xffffffffffffffff) {
    printf("[ERROR] MMAP FAILED!\n");
    exit(-1);
  }
  iVar1 = *local_18;
  pDVar2 = (Data<8U> *)malloc((ulong)(uint)(iVar1 << 3));
  if (pDVar2 == (Data<8U> *)0x0) {
    printf("[ERROR] MALLOC FAILED!\n");
    exit(-1);
  }
  for (local_d4 = 0; local_d4 < iVar1; local_d4 = local_d4 + 1) {
    Data<8U>::operator=(pDVar2 + local_d4,(Data<8U> *)((long)__addr + (long)(local_c * local_d4)));
  }
  munmap(__addr,local_a8.st_size);
  return pDVar2;
}

Assistant:

Data<DATA_LEN>* read_standard_data(const char* PATH, int interval, int* cnt) {
	struct stat buf;
	// printf("Opening file...\n");
	int fd = open(PATH, O_RDONLY);
	fstat(fd, &buf);

	*cnt = buf.st_size / interval;
	uint8_t* raw_addr = (uint8_t*)mmap(NULL, buf.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
	close(fd);
	if (raw_addr == MAP_FAILED) {
		printf("[ERROR] MMAP FAILED!\n");
		exit(-1);
	}

	int num = *cnt;
	void* raw_data = malloc(DATA_LEN * num);
	if (raw_data == NULL) {
		printf("[ERROR] MALLOC FAILED!\n");
		exit(-1);
	}

	Data<DATA_LEN>* data = reinterpret_cast<Data<DATA_LEN>*>(raw_data);
	for (int i = 0; i < num; i++)
		data[i] = *reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i);
	munmap(raw_addr, buf.st_size);
	return data;
}